

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenSolver.h
# Opt level: O1

void __thiscall
Eigen::EigenSolver<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::doComputeEigenvectors
          (EigenSolver<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *this)

{
  MatrixType *pMVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  double *pdVar9;
  EigenSolver<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *pEVar10;
  ulong uVar11;
  ulong uVar12;
  Index inner;
  ulong uVar13;
  ulong uVar14;
  long row;
  ulong uVar15;
  double *pdVar16;
  bool bVar17;
  double dVar18;
  double extraout_XMM0_Qa;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined8 uVar26;
  SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,_2,_1>_>_>
  tmp;
  Scalar lastw;
  Scalar q;
  Scalar vi;
  Scalar w;
  Scalar vr;
  SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,_2,_1>_>_>
  local_1a8;
  double *local_198;
  double local_190;
  double local_188;
  undefined8 local_180;
  double local_178;
  double local_170;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,_2,_1>_>
  local_168;
  double local_148;
  undefined8 uStack_140;
  double *local_130;
  EigenSolver<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *local_128;
  ulong local_120;
  double *local_118;
  undefined1 local_108 [24];
  EigenSolver<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *local_f0;
  Index local_e8;
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false> local_e0;
  Index *local_80;
  
  dVar22 = 0.0;
  lVar6 = 0x22;
  do {
    dVar22 = dVar22 + ABS((this->m_eivec).
                          super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                          m_data.array[lVar6]) +
                      ABS((this->m_eivec).
                          super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                          m_data.array[lVar6 + -2]);
    lVar6 = lVar6 + 1;
  } while (lVar6 == 0x23);
  if ((dVar22 != 0.0) || (NAN(dVar22))) {
    pMVar1 = &this->m_matT;
    dVar22 = dVar22 * 2.220446049250313e-16;
    local_80 = &(this->m_realSchur).m_maxIters;
    local_130 = (this->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                m_storage.m_data.array + 1;
    uVar15 = 1;
    pEVar10 = this;
    local_188 = dVar22;
    local_128 = this;
    do {
      pdVar3 = local_130;
      dVar23 = *(double *)
                (this->m_eivalues).
                super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>.m_storage
                .m_data.array[uVar15]._M_value;
      local_178 = *(double *)
                   ((this->m_eivalues).
                    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>.
                    m_storage.m_data.array[uVar15]._M_value + 8);
      local_170 = dVar23;
      if ((local_178 != 0.0) || (NAN(local_178))) {
        if ((uVar15 == 0) || (0.0 <= local_178)) {
          __assert_fail("0 && \"Internal bug in EigenSolver\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Eigenvalues/EigenSolver.h"
                        ,0x251,
                        "void Eigen::EigenSolver<Eigen::Matrix<double, 2, 2>>::doComputeEigenvectors() [_MatrixType = Eigen::Matrix<double, 2, 2>]"
                       );
        }
        local_180 = 0;
        local_120 = uVar15 - 1;
        local_198 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage
                    .m_data.array + uVar15 * 2 + -2;
        pdVar3 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
                 m_data.array + uVar15 * 2;
        dVar24 = local_198[uVar15];
        dVar25 = (local_198 + uVar15)[1];
        dVar19 = ABS(dVar24);
        if (dVar19 <= ABS(dVar25)) {
          local_108._0_8_ = (double *)0x0;
          local_168.m_rows.m_value = (long)-dVar25;
          local_1a8.m_matrix =
               (Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>
                *)(local_198[uVar15 - 1] - dVar23);
          cdiv<double>((double *)local_108,(double *)&local_168,(double *)&local_1a8,&local_178);
          local_198[uVar15 - 1] = extraout_XMM0_Qa;
          dVar22 = local_188;
        }
        else {
          local_198[uVar15 - 1] = local_178 / dVar24;
          dVar19 = -(pdVar3[uVar15] - dVar23) / dVar24;
        }
        pdVar3[uVar15 - 1] = dVar19;
        local_198[uVar15] = 0.0;
        pdVar3[uVar15] = 1.0;
        uVar11 = local_120;
        pEVar10 = local_128;
        if (1 < uVar15) {
          local_118 = pdVar3;
          if (1 < uVar15 - 2) {
LAB_00126fe2:
            pcVar8 = 
            "Eigen::Block<Eigen::Matrix<double, 2, 2>, 1, 2>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, 2, 2>, BlockRows = 1, BlockCols = 2, InnerPanel = false]"
            ;
            goto LAB_00126ff7;
          }
          lVar6 = uVar15 - local_120;
          if (lVar6 < -1 &&
              (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
              m_data.array + uVar15 + local_120 * 2 + -2 != (double *)0x0) {
LAB_00127001:
            pcVar8 = 
            "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 1, 2>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 1, 2>, 1>, Level = 0]"
            ;
LAB_00127016:
            __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/MapBase.h"
                          ,0x94,pcVar8);
          }
          uVar11 = lVar6 + 1U | local_120;
          if (((long)uVar11 < 0) || (1 - lVar6 < (long)local_120)) {
LAB_00127020:
            pcVar8 = 
            "Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 1, 2>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, 2, 2>, 1, 2>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
            ;
          }
          else {
            if (uVar15 != 2) goto LAB_00126fb4;
            if ((lVar6 < -1) && (local_198 + local_120 != (double *)0x0)) {
LAB_00126f9d:
              pcVar8 = 
              "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, -1, 1>, Level = 0]"
              ;
              goto LAB_00127016;
            }
            if (-1 < (long)uVar11) {
              if (lVar6 + 1U != 0) {
                uVar15 = local_120;
                if (lVar6 < 0) {
LAB_0012703f:
                  __assert_fail("mat.rows()>0 && mat.cols()>0 && \"you are using an empty matrix\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Redux.h"
                                ,0xaf,
                                "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double, double>, const Eigen::Transpose<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 1, 2>, 1>>, const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, -1, 1>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double, double>, const Eigen::Transpose<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 1, 2>, 1>>, const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, -1, 1>>, Traversal = 0, Unrolling = 0]"
                               );
                }
                for (; uVar15 != 2; uVar15 = uVar15 + 1) {
                }
              }
LAB_00126fb4:
              pcVar8 = 
              "Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, 2, 2>, BlockRows = 2, BlockCols = 1, InnerPanel = true]"
              ;
LAB_00126ff7:
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                            ,0x76,pcVar8);
            }
LAB_00126fcb:
            pcVar8 = 
            "Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
            ;
          }
          __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                        ,0x8d,pcVar8);
        }
      }
      else {
        pdVar2 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
                 m_data.array + uVar15 * 2;
        pdVar2[uVar15] = 1.0;
        uVar11 = uVar15;
        if (uVar15 != 0) {
          pdVar16 = local_130 + uVar15;
          dVar24 = 0.0;
          dVar25 = 0.0;
          uVar26 = 0;
          uVar7 = uVar15;
          uVar13 = uVar15;
          do {
            if (2 < uVar13) goto LAB_00126fe2;
            uVar14 = uVar13 - 1;
            lVar6 = uVar15 - uVar7;
            pdVar9 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                     m_storage.m_data.array + uVar13 + uVar7 * 2 + -1;
            if (lVar6 < -1 && pdVar9 != (double *)0x0) goto LAB_00127001;
            uVar12 = lVar6 + 1U | uVar7;
            if (((long)uVar12 < 0) || (1 - lVar6 < (long)uVar7)) goto LAB_00127020;
            if (uVar15 != 1) goto LAB_00126fb4;
            if ((lVar6 < -1) && (pdVar2 + uVar7 != (double *)0x0)) goto LAB_00126f9d;
            if ((long)uVar12 < 0) goto LAB_00126fcb;
            if (lVar6 + 1U == 0) {
              dVar19 = 0.0;
            }
            else {
              if (lVar6 < 0) goto LAB_0012703f;
              dVar19 = *pdVar9 * pdVar2[uVar7];
              if (uVar7 != 1) {
                pdVar9 = pdVar16 + uVar7 * 2;
                uVar12 = uVar7;
                do {
                  dVar19 = dVar19 + *pdVar9 * pdVar3[uVar12 + 2];
                  uVar12 = uVar12 + 1;
                  pdVar9 = pdVar9 + 2;
                } while (uVar12 != 1);
              }
            }
            dVar18 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                     m_storage.m_data.array[uVar13 * 3 + -3] - dVar23;
            dVar20 = *(double *)
                      ((this->m_eivalues).
                       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>.
                       m_storage.m_data.array[uVar13 - 1]._M_value + 8);
            if (0.0 <= dVar20) {
              if ((dVar20 != 0.0) || (NAN(dVar20))) {
                dVar4 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                        m_storage.m_data.array[uVar13 * 3 + -1];
                dVar5 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                        m_storage.m_data.array[uVar13 * 3 + -2];
                dVar21 = *(double *)
                          (this->m_eivalues).
                          super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>
                          .m_storage.m_data.array[uVar13 - 1]._M_value - dVar23;
                dVar20 = (dVar4 * dVar24 - dVar19 * dVar25) / (dVar21 * dVar21 + dVar20 * dVar20);
                pdVar2[uVar13 - 1] = dVar20;
                if (ABS(dVar4) <= ABS(dVar25)) {
                  pdVar2[uVar13] = (-dVar5 * dVar20 - dVar24) / dVar25;
                }
                else {
                  pdVar2[uVar13] = (-dVar18 * dVar20 - dVar19) / dVar4;
                }
              }
              else {
                if ((dVar18 == 0.0) && (!NAN(dVar18))) {
                  dVar18 = dVar22;
                }
                pdVar2[uVar13 - 1] = -dVar19 / dVar18;
              }
              dVar19 = ABS(pdVar2[uVar13 - 1]);
              uVar7 = uVar14;
              if (1.0 < dVar19 * 2.220446049250313e-16 * dVar19) {
                local_108._0_8_ = pdVar2 + (uVar13 - 1);
                local_168.m_rows.m_value = 3 - uVar13;
                local_e0.
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
                .
                super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
                .m_rows.m_value = 2;
                local_e0.
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
                .
                super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
                ._16_8_ = 2;
                local_1a8.m_matrix =
                     (Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>
                      *)local_108;
                local_1a8.m_functor = (scalar_quotient_op<double,_double> *)&local_168;
                local_190 = dVar24;
                local_168.m_functor.m_other = dVar19;
                local_148 = dVar25;
                uStack_140 = uVar26;
                local_108._8_8_ = local_168.m_rows.m_value;
                local_f0 = (EigenSolver<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)pdVar2;
                local_e0.
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
                .
                super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
                .m_data = (PointerType)pMVar1;
                SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_2,_1>_>_>
                ::operator=(&local_1a8,
                            (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,_2,_1>_>
                             *)local_1a8.m_functor);
                dVar22 = local_188;
                dVar23 = local_170;
                dVar24 = local_190;
                dVar25 = local_148;
                uVar26 = uStack_140;
              }
            }
            else {
              dVar24 = dVar19;
              dVar25 = dVar18;
              uVar26 = 0;
            }
            pdVar16 = pdVar16 + -1;
            bVar17 = uVar13 == 2;
            pEVar10 = local_128;
            uVar13 = uVar14;
          } while (bVar17);
        }
      }
      uVar15 = uVar11 - 1;
    } while (0 < (long)uVar11);
    lVar6 = 1;
    do {
      local_108._16_8_ = lVar6 + 1;
      local_e0.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
      .m_data = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
                m_data.array + lVar6 * 2;
      local_e8 = 2;
      local_e0.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.m_outerStride =
           2;
      local_e0.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
      .m_outerStride = 2;
      row = 0;
      local_108._0_8_ = pEVar10;
      local_f0 = pEVar10;
      local_e0.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
      .m_rows.m_value = local_108._16_8_;
      local_e0.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_0>.m_data =
           local_e0.
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
           .m_data;
      local_e0.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.m_xpr = pMVar1;
      do {
        internal::
        product_coeff_impl<0,_-1,_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>,_double>
        ::run(row,0,(Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true> *)local_108,&local_e0,
              (double *)&local_168);
        (pEVar10->m_tmp).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
        m_data.array[row] = (double)local_168.m_rows.m_value;
        row = row + 1;
      } while (row == 1);
      dVar22 = (pEVar10->m_tmp).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
               m_storage.m_data.array[1];
      pdVar3 = (pEVar10->m_eivec).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
               m_storage.m_data.array + lVar6 * 2;
      *pdVar3 = (pEVar10->m_tmp).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                m_storage.m_data.array[0];
      pdVar3[1] = dVar22;
      bVar17 = lVar6 == 1;
      lVar6 = lVar6 + -1;
    } while (bVar17);
  }
  return;
}

Assistant:

void EigenSolver<MatrixType>::doComputeEigenvectors()
{
  using std::abs;
  const Index size = m_eivec.cols();
  const Scalar eps = NumTraits<Scalar>::epsilon();

  // inefficient! this is already computed in RealSchur
  Scalar norm(0);
  for (Index j = 0; j < size; ++j)
  {
    norm += m_matT.row(j).segment((std::max)(j-1,Index(0)), size-(std::max)(j-1,Index(0))).cwiseAbs().sum();
  }
  
  // Backsubstitute to find vectors of upper triangular form
  if (norm == 0.0)
  {
    return;
  }

  for (Index n = size-1; n >= 0; n--)
  {
    Scalar p = m_eivalues.coeff(n).real();
    Scalar q = m_eivalues.coeff(n).imag();

    // Scalar vector
    if (q == Scalar(0))
    {
      Scalar lastr(0), lastw(0);
      Index l = n;

      m_matT.coeffRef(n,n) = 1.0;
      for (Index i = n-1; i >= 0; i--)
      {
        Scalar w = m_matT.coeff(i,i) - p;
        Scalar r = m_matT.row(i).segment(l,n-l+1).dot(m_matT.col(n).segment(l, n-l+1));

        if (m_eivalues.coeff(i).imag() < 0.0)
        {
          lastw = w;
          lastr = r;
        }
        else
        {
          l = i;
          if (m_eivalues.coeff(i).imag() == 0.0)
          {
            if (w != 0.0)
              m_matT.coeffRef(i,n) = -r / w;
            else
              m_matT.coeffRef(i,n) = -r / (eps * norm);
          }
          else // Solve real equations
          {
            Scalar x = m_matT.coeff(i,i+1);
            Scalar y = m_matT.coeff(i+1,i);
            Scalar denom = (m_eivalues.coeff(i).real() - p) * (m_eivalues.coeff(i).real() - p) + m_eivalues.coeff(i).imag() * m_eivalues.coeff(i).imag();
            Scalar t = (x * lastr - lastw * r) / denom;
            m_matT.coeffRef(i,n) = t;
            if (abs(x) > abs(lastw))
              m_matT.coeffRef(i+1,n) = (-r - w * t) / x;
            else
              m_matT.coeffRef(i+1,n) = (-lastr - y * t) / lastw;
          }

          // Overflow control
          Scalar t = abs(m_matT.coeff(i,n));
          if ((eps * t) * t > Scalar(1))
            m_matT.col(n).tail(size-i) /= t;
        }
      }
    }
    else if (q < Scalar(0) && n > 0) // Complex vector
    {
      Scalar lastra(0), lastsa(0), lastw(0);
      Index l = n-1;

      // Last vector component imaginary so matrix is triangular
      if (abs(m_matT.coeff(n,n-1)) > abs(m_matT.coeff(n-1,n)))
      {
        m_matT.coeffRef(n-1,n-1) = q / m_matT.coeff(n,n-1);
        m_matT.coeffRef(n-1,n) = -(m_matT.coeff(n,n) - p) / m_matT.coeff(n,n-1);
      }
      else
      {
        std::complex<Scalar> cc = cdiv<Scalar>(0.0,-m_matT.coeff(n-1,n),m_matT.coeff(n-1,n-1)-p,q);
        m_matT.coeffRef(n-1,n-1) = numext::real(cc);
        m_matT.coeffRef(n-1,n) = numext::imag(cc);
      }
      m_matT.coeffRef(n,n-1) = 0.0;
      m_matT.coeffRef(n,n) = 1.0;
      for (Index i = n-2; i >= 0; i--)
      {
        Scalar ra = m_matT.row(i).segment(l, n-l+1).dot(m_matT.col(n-1).segment(l, n-l+1));
        Scalar sa = m_matT.row(i).segment(l, n-l+1).dot(m_matT.col(n).segment(l, n-l+1));
        Scalar w = m_matT.coeff(i,i) - p;

        if (m_eivalues.coeff(i).imag() < 0.0)
        {
          lastw = w;
          lastra = ra;
          lastsa = sa;
        }
        else
        {
          l = i;
          if (m_eivalues.coeff(i).imag() == RealScalar(0))
          {
            std::complex<Scalar> cc = cdiv(-ra,-sa,w,q);
            m_matT.coeffRef(i,n-1) = numext::real(cc);
            m_matT.coeffRef(i,n) = numext::imag(cc);
          }
          else
          {
            // Solve complex equations
            Scalar x = m_matT.coeff(i,i+1);
            Scalar y = m_matT.coeff(i+1,i);
            Scalar vr = (m_eivalues.coeff(i).real() - p) * (m_eivalues.coeff(i).real() - p) + m_eivalues.coeff(i).imag() * m_eivalues.coeff(i).imag() - q * q;
            Scalar vi = (m_eivalues.coeff(i).real() - p) * Scalar(2) * q;
            if ((vr == 0.0) && (vi == 0.0))
              vr = eps * norm * (abs(w) + abs(q) + abs(x) + abs(y) + abs(lastw));

            std::complex<Scalar> cc = cdiv(x*lastra-lastw*ra+q*sa,x*lastsa-lastw*sa-q*ra,vr,vi);
            m_matT.coeffRef(i,n-1) = numext::real(cc);
            m_matT.coeffRef(i,n) = numext::imag(cc);
            if (abs(x) > (abs(lastw) + abs(q)))
            {
              m_matT.coeffRef(i+1,n-1) = (-ra - w * m_matT.coeff(i,n-1) + q * m_matT.coeff(i,n)) / x;
              m_matT.coeffRef(i+1,n) = (-sa - w * m_matT.coeff(i,n) - q * m_matT.coeff(i,n-1)) / x;
            }
            else
            {
              cc = cdiv(-lastra-y*m_matT.coeff(i,n-1),-lastsa-y*m_matT.coeff(i,n),lastw,q);
              m_matT.coeffRef(i+1,n-1) = numext::real(cc);
              m_matT.coeffRef(i+1,n) = numext::imag(cc);
            }
          }

          // Overflow control
          using std::max;
          Scalar t = (max)(abs(m_matT.coeff(i,n-1)),abs(m_matT.coeff(i,n)));
          if ((eps * t) * t > Scalar(1))
            m_matT.block(i, n-1, size-i, 2) /= t;

        }
      }
      
      // We handled a pair of complex conjugate eigenvalues, so need to skip them both
      n--;
    }
    else
    {
      eigen_assert(0 && "Internal bug in EigenSolver"); // this should not happen
    }
  }

  // Back transformation to get eigenvectors of original matrix
  for (Index j = size-1; j >= 0; j--)
  {
    m_tmp.noalias() = m_eivec.leftCols(j+1) * m_matT.col(j).segment(0, j+1);
    m_eivec.col(j) = m_tmp;
  }
}